

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_helper.cpp
# Opt level: O0

pair<double,_double> __thiscall Performance_Test::BaseTimerContainer::mean(BaseTimerContainer *this)

{
  bool bVar1;
  undefined8 uVar2;
  iterator __last;
  iterator this_00;
  list<double,_std::allocator<double>_> *in_RDI;
  double sigma;
  double mean;
  vector<double,_std::allocator<double>_> *in_stack_00000030;
  vector<double,_std::allocator<double>_> time;
  list<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  list<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  double local_68;
  double local_60;
  allocator_type *in_stack_ffffffffffffffa8;
  imageException *in_stack_ffffffffffffffb0;
  _List_iterator<double> in_stack_ffffffffffffffc0;
  pair<double,_double> local_10;
  
  bVar1 = std::__cxx11::list<double,_std::allocator<double>_>::empty(in_RDI);
  if (!bVar1) {
    std::__cxx11::list<double,_std::allocator<double>_>::pop_front(in_stack_ffffffffffffff80);
    __last = std::__cxx11::list<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
    this_00 = std::__cxx11::list<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
    std::allocator<double>::allocator((allocator<double> *)0x1707d0);
    std::vector<double,std::allocator<double>>::vector<std::_List_iterator<double>,void>
              ((vector<double,_std::allocator<double>_> *)this_00._M_node,in_stack_ffffffffffffffc0,
               (_List_iterator<double>)__last._M_node,in_stack_ffffffffffffffa8);
    std::allocator<double>::~allocator((allocator<double> *)0x1707f5);
    local_60 = 0.0;
    local_68 = 0.0;
    anon_unknown.dwarf_d8095::getDistribution(in_stack_00000030,(double *)mean,(double *)sigma);
    std::pair<double,_double>::pair<double_&,_double_&,_true>(&local_10,&local_60,&local_68);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_RDI);
    return local_10;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  imageException::imageException(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  __cxa_throw(uVar2,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

std::pair < double, double > BaseTimerContainer::mean()
    {
        if( _time.empty() )
            throw imageException( "Cannot find mean value of empty array" );

        // We remove first value because it is on 'cold' cache
        _time.pop_front();

        // Remove all values what are out of +/- 6 sigma range
        std::vector < double > time ( _time.begin(), _time.end() );

        double mean  = 0.0;
        double sigma = 0.0;

        getDistribution( time, mean, sigma );

        // return results in milliseconds
        return std::pair<double, double>(  mean, sigma );
    }